

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmZeroInitialize(ExpressionContext *ctx,VmModule *module,ExprZeroInitialize *node)

{
  Allocator *pAVar1;
  SynBase *source;
  int iVar2;
  VmValue *pVVar3;
  ulong uVar4;
  VmConstant *pVVar5;
  undefined4 extraout_var;
  VmConstant *el1;
  VmConstant *el2;
  TypeBase *pTVar6;
  VmValueType VVar7;
  VmType type;
  SynBase *local_48;
  
  pTVar6 = node->address->type;
  if ((pTVar6 == (TypeBase *)0x0) || (pTVar6->typeID != 0x12)) {
    pTVar6 = (TypeBase *)0x0;
  }
  if (pTVar6 == (TypeBase *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xd7d,
                  "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                 );
  }
  pVVar3 = CompileVm(ctx,module,node->address);
  type = GetVmType(ctx,(TypeBase *)pTVar6[1]._vptr_TypeBase);
  VVar7 = type.type;
  uVar4 = type._0_8_ >> 0x20;
  if ((VVar7 == VM_TYPE_INT && uVar4 == 4) ||
     ((VVar7 & ~VM_TYPE_INT) == VM_TYPE_DOUBLE && type.size == 8)) {
    pVVar5 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,type);
  }
  else {
    switch(VVar7) {
    case VM_TYPE_POINTER:
      pVVar5 = CreateConstantPointer
                         (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                          (TypeBase *)pTVar6[1]._vptr_TypeBase,false);
      goto LAB_0019ea16;
    case VM_TYPE_FUNCTION_REF:
    case VM_TYPE_ARRAY_REF:
      local_48 = (node->super_ExprBase).source;
      pVVar5 = CreateConstantPointer
                         (module->allocator,local_48,0,(VariableData *)0x0,ctx->typeNullPtr,false);
      el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      break;
    case VM_TYPE_AUTO_REF:
      local_48 = (node->super_ExprBase).source;
      pVVar5 = CreateConstantInt(module->allocator,local_48,0);
      el1 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
      break;
    case VM_TYPE_AUTO_ARRAY:
      local_48 = (node->super_ExprBase).source;
      pVVar5 = CreateConstantInt(module->allocator,local_48,0);
      el1 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
      el2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      goto LAB_0019ebfe;
    case VM_TYPE_STRUCT:
      if (uVar4 != 0) {
        source = (node->super_ExprBase).source;
        pVVar5 = CreateConstantZero(ctx->allocator,source,(VmType)ZEXT816(0x400000001));
        anon_unknown.dwarf_10d873::CreateSetRange
                  (module,source,pVVar3,type.size >> 2,&pVVar5->super_VmValue,4);
      }
      goto LAB_0019ea39;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xdae,
                    "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                   );
    }
    el2 = (VmConstant *)0x0;
LAB_0019ebfe:
    pVVar5 = (VmConstant *)
             anon_unknown.dwarf_10d873::CreateConstruct
                       (module,local_48,type,&pVVar5->super_VmValue,&el1->super_VmValue,
                        &el2->super_VmValue,&pVVar5->super_VmValue);
  }
LAB_0019ea16:
  anon_unknown.dwarf_10d873::CreateStore
            (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar6[1]._vptr_TypeBase,pVVar3,
             &pVVar5->super_VmValue,0);
LAB_0019ea39:
  iVar2 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
  pVVar3 = (VmValue *)CONCAT44(extraout_var,iVar2);
  pAVar1 = module->allocator;
  pVVar3->typeID = 0;
  pVVar3->source = (SynBase *)0x0;
  (pVVar3->comment).begin = (char *)0x0;
  (pVVar3->type).type = VM_TYPE_VOID;
  (pVVar3->type).size = 0;
  (pVVar3->type).structType = (TypeBase *)0x0;
  (pVVar3->comment).end = (char *)0x0;
  (pVVar3->users).allocator = pAVar1;
  (pVVar3->users).data = (pVVar3->users).little;
  (pVVar3->users).count = 0;
  (pVVar3->users).max = 8;
  pVVar3->hasSideEffects = false;
  pVVar3->hasMemoryAccess = false;
  pVVar3->canBeRemoved = true;
  pVVar3->hasKnownSimpleUse = false;
  pVVar3->hasKnownNonSimpleUse = false;
  pVVar3->_vptr_VmValue = (_func_int **)&PTR__VmValue_0022ac70;
  pVVar3 = anon_unknown.dwarf_10d873::CheckType(ctx,&node->super_ExprBase,pVVar3);
  return pVVar3;
}

Assistant:

VmValue* CompileVmZeroInitialize(ExpressionContext &ctx, VmModule *module, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	VmValue *address = CompileVm(ctx, module, node->address);

	VmType vmType = GetVmType(ctx, refType->subType);

	if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
	{
		VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_POINTER)
	{
		VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, refType->subType, false);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_FUNCTION_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_ARRAY_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_ARRAY)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_STRUCT)
	{
		if(vmType.size != 0)
			CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
	}
	else// if(vmType != VmType::Void)
	{
		assert(!"unknown type");
	}

	return CheckType(ctx, node, CreateVoid(module));
}